

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O3

bool __thiscall
xscript::parser::ast::parse_global_declarations
          (ast *this,
          unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
          *parent)

{
  token_t_conflict tVar1;
  
  while( true ) {
    while( true ) {
      while (tVar1 = (this->cur_token).type, 0x44 < (int)tVar1) {
        if (tVar1 == TK_FUNCTION) {
          parse_function_declaration(this,parent);
        }
        else {
          if (tVar1 != TK_TYPE) {
            return true;
          }
          parse_type_declaration(this,parent);
        }
      }
      if (tVar1 != TK_VAR) break;
      parse_variable_declaration(this,parent);
    }
    if (tVar1 != TK_CONST) break;
    parse_constant_declaration(this,parent);
  }
  return true;
}

Assistant:

bool ast::parse_global_declarations(std::unique_ptr<ast_node>& parent) {
    while (cur_token.type == tokenizer::TK_VAR ||
        cur_token.type == tokenizer::TK_FUNCTION ||
        cur_token.type == tokenizer::TK_CONST ||
        cur_token.type == tokenizer::TK_TYPE) {
        switch (cur_token.type) {
            case tokenizer::TK_VAR: parse_variable_declaration(parent); break;
            case tokenizer::TK_FUNCTION: parse_function_declaration(parent); break;
            case tokenizer::TK_CONST: parse_constant_declaration(parent); break;
            case tokenizer::TK_TYPE: parse_type_declaration(parent); break;
            default:
                return syntax_error({"assertion: parse_global_declarations"});
        }
    }

    return true;
}